

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O3

void __thiscall params::params(params *this,int argc,char **argv)

{
  size_t *psVar1;
  char *pcVar2;
  int iVar3;
  _List_node_base *p_Var4;
  size_t sVar5;
  long *plVar6;
  invalid_argument *piVar7;
  option *poVar8;
  undefined8 uVar9;
  long *plVar10;
  __integer_from_chars_result_type<unsigned_int> _Var11;
  uint i;
  ostringstream oss;
  undefined1 auStack_1e8 [4];
  uint local_1e4;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  _List_node_base *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  
  this->measure = 0;
  this->max_steps = 100;
  this->help_required = false;
  local_1c0 = (_List_node_base *)&this->capacities;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = local_1c0;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = local_1c0;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  do {
    while( true ) {
      while( true ) {
        poVar8 = params::long_options;
        iVar3 = getopt_long(argc,argv,"a:m:s:h",params::long_options,0);
        pcVar2 = _optarg;
        if (iVar3 < 0x68) break;
        if (iVar3 == 0x68) {
          this->help_required = true;
        }
        else if (iVar3 == 0x6d) {
          if ((local_1b0 & 1) != 0) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Measurement was already specified");
            goto LAB_0010433f;
          }
          iVar3 = anon_unknown.dwarf_fdee::parse<int>(_optarg);
          this->measure = iVar3;
          local_1b0 = CONCAT71((int7)((ulong)poVar8 >> 8),1);
          if (iVar3 < 1) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar7,"Invalid measurement, must be greater than 0");
            goto LAB_0010433f;
          }
        }
        else if (iVar3 == 0x73) {
          if ((local_1b8 & 1) != 0) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Max number of steps already specified");
            goto LAB_0010433f;
          }
          local_1e4 = 0;
          sVar5 = strlen(_optarg);
          uVar9 = 0;
          _Var11 = std::from_chars<unsigned_int>(pcVar2,pcVar2 + sVar5,&local_1e4,10);
          if (*_Var11.ptr != '\0') {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            local_1e0[0] = local_1d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e0,"Invalid argument: ","");
            plVar6 = (long *)std::__cxx11::string::append((char *)local_1e0);
            local_1a8 = (long *)*plVar6;
            plVar10 = plVar6 + 2;
            if (local_1a8 == plVar10) {
              local_198 = *plVar10;
              lStack_190 = plVar6[3];
              local_1a8 = &local_198;
            }
            else {
              local_198 = *plVar10;
            }
            local_1a0 = plVar6[1];
            *plVar6 = (long)plVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::invalid_argument::invalid_argument(piVar7,(string *)&local_1a8);
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          this->max_steps = local_1e4;
          local_1b8 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          if (local_1e4 == 0) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,"Invalid maximum number of steps");
            goto LAB_0010433f;
          }
        }
      }
      if (iVar3 != 0x61) break;
      iVar3 = anon_unknown.dwarf_fdee::parse<int>(_optarg);
      if (iVar3 < 1) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar7,"Bucket capacity must be greater than 0");
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var4[1]._M_next = iVar3;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
    }
    if (iVar3 == -1) {
      if (_optind < argc) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"invalid argument: ",0x12);
        if (_optind < argc) {
          do {
            pcVar2 = argv[_optind];
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)auStack_1e8 + (int)*(undefined8 *)((long)local_1a8 + -0x18) +
                              0x40);
            }
            else {
              sVar5 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar5)
              ;
            }
            local_1e0[0] = (undefined1 *)CONCAT71(local_1e0[0]._1_7_,0x20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_1e0,1);
            _optind = _optind + 1;
          } while (_optind < argc);
        }
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar7,(string *)local_1e0);
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (this->help_required != false) {
        return;
      }
      p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&local_1c0->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      if (p_Var4 == local_1c0) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar7,"No buckets were added");
      }
      else {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *(int *)&p_Var4[1]._M_next;
          p_Var4 = p_Var4->_M_next;
        } while (p_Var4 != local_1c0);
        if (this->measure <= iVar3) {
          return;
        }
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar7,"Required measurement exceeds total bucket capacity");
      }
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while (iVar3 != 0x3f);
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"Invalid argument");
LAB_0010433f:
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

params::params(const int argc, char* argv[])
{
	bool measurement_specified = false;
	bool max_steps_specified = false;

	while (true) {
		static option long_options[] = {
			{"add-bucket", true, nullptr, 'a'},
			{"measure", true, nullptr, 'm'},
			{"max-steps", true, nullptr, 's'},
			{"help", false, nullptr, 'h'},
			{nullptr, false, nullptr, 0}
		};

		int c = getopt_long(argc, argv, "a:m:s:h", long_options, nullptr);
		if (c == -1)
			break;

		switch (c) {
		case 'a' : {
			int capacity = parse<int>(optarg);
			if (capacity < 1)
				throw std::invalid_argument{
					"Bucket capacity must be greater than 0"};
			capacities.emplace_back(capacity);
			break;
		}
		case 'm' : {
			if (measurement_specified)
				throw std::invalid_argument{
					"Measurement was already specified"};
			measurement_specified = true;
			measure = parse<int>(optarg);
			if (measure < 1)
				throw std::invalid_argument{
					"Invalid measurement, must be greater than 0"};
			break;
		}
		case 's' : {
			if (max_steps_specified)
				throw std::invalid_argument{
					"Max number of steps already specified"};
			max_steps_specified = true;
			max_steps = parse<unsigned>(optarg);
			if (max_steps < 1)
				throw std::invalid_argument{
					"Invalid maximum number of steps"};
			break;
		}
		case 'h' :
			help_required = true;
			break;
		case '?' :
			throw std::invalid_argument{"Invalid argument"};
			break;
		}
	}

	if (optind < argc) {
		std::ostringstream oss;
		oss << "invalid argument: ";
		for (; optind < argc; ++optind)
			oss << argv[optind] << ' ';
		throw std::invalid_argument{oss.str()};
	}

	if (!help_required) {
		try {
			if (capacities.empty())
				throw std::invalid_argument{"No buckets were added"};
			if (std::accumulate(capacities.begin(), capacities.end(), 0) < measure)
				throw std::invalid_argument{
					"Required measurement exceeds total bucket capacity"};
		}
		catch (const std::exception& e) {
			help_required = true;
			std::ostringstream oss;
			oss << e.what() << "\n\n" << help;
			throw std::invalid_argument{oss.str()};
		}
	}
}